

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

int Gia_ManPoIsToRemove(Gia_Man_t *p,Gia_Obj_t *pObj,int Value)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar1 = (uint)*(undefined8 *)pObj;
  if (((int)uVar1 < 0) && (uVar2 = uVar1 & 0x1fffffff, uVar2 != 0x1fffffff)) {
    if (Value == -1) {
      bVar3 = (~*(ulong *)(pObj + -(ulong)uVar2) & 0x1fffffff1fffffff) == 0;
    }
    else {
      if (1 < (uint)Value) {
        __assert_fail("Value == 0 || Value == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                      ,0x857,"int Gia_ManPoIsToRemove(Gia_Man_t *, Gia_Obj_t *, int)");
      }
      if ((~*(ulong *)(pObj + -(ulong)uVar2) & 0x1fffffff1fffffff) == 0) {
        bVar3 = (uVar1 >> 0x1d & 1) == Value;
      }
      else {
        bVar3 = false;
      }
    }
    return (int)bVar3;
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                ,0x854,"int Gia_ManPoIsToRemove(Gia_Man_t *, Gia_Obj_t *, int)");
}

Assistant:

int Gia_ManPoIsToRemove( Gia_Man_t * p, Gia_Obj_t * pObj, int Value )
{
    assert( Gia_ObjIsCo(pObj) );
    if ( Value == -1 )
        return Gia_ObjIsConst0(Gia_ObjFanin0(pObj));
    assert( Value == 0 || Value == 1 );
    return Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && Value == Gia_ObjFaninC0(pObj);
}